

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

string * __thiscall
dmlc::JSONReader::line_info_abi_cxx11_(string *__return_storage_ptr__,JSONReader *this)

{
  istream *piVar1;
  size_t sVar2;
  char temp [64];
  ostringstream os;
  char acStack_1d8 [72];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," Line ",6);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  piVar1 = this->is_;
  std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + (char)piVar1);
  std::istream::getline((char *)piVar1,(long)acStack_1d8,'@');
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,", around ^`",0xb);
  sVar2 = strlen(acStack_1d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,acStack_1d8,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"`",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

inline std::string line_info() const {
#ifndef _LIBCPP_SGX_NO_IOSTREAMS
    char temp[64];
    std::ostringstream os;
    os << " Line " << std::max(line_count_r_, line_count_n_);
    is_->getline(temp, 64);
    os << ", around ^`" << temp << "`";
    return os.str();
#else
    std::string info = " Line ";
    info += std::to_string(std::max(line_count_r_, line_count_n_));

    // string getline
    size_t end_pos = is_->find('\n');
    end_pos = std::min((size_t)64,
                       end_pos == std::string::npos ? is_->size() : end_pos);
    std::string line = is_->substr(0, end_pos);
    is_->erase(0, line.size() + 1); // +1 for \n

    info += ", around ^`" + line + "`";
    return info;
#endif
  }